

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

uint16 crnlib::etc1_block::pack_delta3(int r,int g,int b)

{
  return ((short)r + (short)(r >> 0x1f) * -8) * 0x40 | ((short)g + (short)(g >> 0x1f) * -8) * 8 |
         (short)b + (short)(b >> 0x1f) * -8;
}

Assistant:

uint16 etc1_block::pack_delta3(int r, int g, int b)
    {
        CRNLIB_ASSERT((r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax));
        CRNLIB_ASSERT((g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax));
        CRNLIB_ASSERT((b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax));
        if (r < 0)
        {
            r += 8;
        }
        if (g < 0)
        {
            g += 8;
        }
        if (b < 0)
        {
            b += 8;
        }
        return static_cast<uint16>(b | (g << 3) | (r << 6));
    }